

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O3

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::CreateRawTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          uint32_t version,uint32_t locktime,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  ConfidentialTransactionController *this_00;
  string local_90;
  ConfidentialTransactionController ctxc;
  
  this_00 = &ctxc;
  ConfidentialTransactionController::ConfidentialTransactionController(this_00,version,locktime);
  AbstractTransactionController::GetHex_abi_cxx11_
            (&local_90,&this_00->super_AbstractTransactionController);
  AddRawTransaction(__return_storage_ptr__,(ElementsTransactionApi *)this_00,&local_90,txins,pegins,
                    txouts,pegouts,txout_fee,pegout_addresses);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
  core::ConfidentialTransaction::~ConfidentialTransaction(&ctxc.transaction_);
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::CreateRawTransaction(
    uint32_t version, uint32_t locktime,
    const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(version, locktime);
  return AddRawTransaction(
      ctxc.GetHex(), txins, pegins, txouts, pegouts, txout_fee,
      pegout_addresses);
}